

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O1

void __thiscall StatisticsMgr::~StatisticsMgr(StatisticsMgr *this)

{
  InternalNode *this_00;
  
  this_00 = (this->llStats).pnHead;
  (this->llStats).pnLastRef = this_00;
  while (this_00 != (InternalNode *)0x0) {
    (this->llStats).pnHead = this_00->next;
    Statistic::~Statistic(&this_00->Data);
    operator_delete(this_00);
    this_00 = (this->llStats).pnHead;
    (this->llStats).pnLastRef = this_00;
  }
  (this->llStats).iLength = 0;
  (this->llStats).pnHead = (InternalNode *)0x0;
  (this->llStats).pnTail = (InternalNode *)0x0;
  (this->llStats).pnLastRef = (InternalNode *)0x0;
  (this->llStats).iLastRef = -1;
  return;
}

Assistant:

StatisticsMgr() {}